

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::TypeBuilder::Impl::Entry::Entry(Entry *this)

{
  Signature local_88;
  HeapTypeInfo local_78;
  Signature local_28;
  Signature local_18;
  Entry *this_local;
  
  local_18.results.id = (uintptr_t)this;
  std::
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>
  ::unique_ptr<std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>,void>
            ((unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>
              *)this);
  this->initialized = false;
  Signature::Signature(&local_28);
  std::make_unique<wasm::(anonymous_namespace)::HeapTypeInfo,wasm::Signature>(&local_18);
  std::
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ::operator=(&this->info,
              (unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
               *)&local_18);
  std::
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                 *)&local_18);
  Signature::Signature(&local_88);
  anon_unknown_0::HeapTypeInfo::HeapTypeInfo(&local_78,local_88);
  set(this,&local_78);
  anon_unknown_0::HeapTypeInfo::~HeapTypeInfo(&local_78);
  this->initialized = false;
  return;
}

Assistant:

Entry() {
      // We need to eagerly allocate the HeapTypeInfo so we have a TypeID to use
      // to refer to it before it is initialized. Arbitrarily choose a default
      // value.
      info = std::make_unique<HeapTypeInfo>(Signature());
      set(Signature());
      initialized = false;
    }